

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O1

void poly_short_sample(poly *out,uint8_t *in)

{
  size_t i;
  uint uVar1;
  
  i = 0;
  do {
    uVar1 = (uint)in[i] + ((uint)in[i] * 0x5555 >> 0x10) * -3;
    uVar1 = (uVar1 >> 1 & uVar1) - 1 & uVar1;
    (out->field_0).v[i] = ((ushort)((uVar1 & 0xffff) >> 1) ^ 1) - 1 | (ushort)uVar1;
    i = i + 1;
  } while (i != 700);
  (out->field_0).vectors[0x57][1] = 0;
  return;
}

Assistant:

static void poly_short_sample(struct poly *out,
                              const uint8_t in[HRSS_SAMPLE_BYTES]) {
  static_assert(HRSS_SAMPLE_BYTES == N - 1, "HRSS_SAMPLE_BYTES incorrect");
  for (size_t i = 0; i < N - 1; i++) {
    uint16_t v = mod3(in[i]);
    // Map {0, 1, 2} -> {0, 1, 0xffff}
    v |= ((v >> 1) ^ 1) - 1;
    out->v[i] = v;
  }
  out->v[N - 1] = 0;
  poly_normalize(out);
}